

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = (ulong)(insn & 0x1f);
  uVar3 = insn >> 5 & 0x1f;
  uVar1 = MCInst_getOpcode(Inst);
  uVar5 = insn >> 10;
  uVar6 = uVar5 & 0x3f;
  if ((int)insn < 0) {
    uVar2 = 4;
    if (uVar4 != 0x1f) {
      uVar2 = GPR64DecoderTable[uVar4];
    }
    if (uVar1 == 0x58) {
      uVar2 = GPR64DecoderTable[uVar4];
    }
    MCOperand_CreateReg0(Inst,uVar2);
    MCOperand_CreateReg0(Inst,GPR64DecoderTable[uVar3]);
    uVar1 = (insn >> 0x10 & 0x40 | uVar6) ^ 0x3f;
    uVar3 = 0xffffffff;
    do {
      uVar2 = uVar3 + 1;
      if (uVar3 == 0x1d) break;
      uVar1 = uVar1 * 2;
      uVar3 = uVar2;
    } while (-1 < (int)uVar1);
    if (0x1e < uVar2) {
      return MCDisassembler_Fail;
    }
    if ((uVar6 | -(0x40000000U >> ((byte)uVar2 & 0x1f))) == 0xffffffff) {
      return MCDisassembler_Fail;
    }
    uVar5 = uVar5 & 0x1fff;
  }
  else {
    uVar2 = 5;
    if (uVar4 != 0x1f) {
      uVar2 = GPR32DecoderTable[uVar4];
    }
    if (uVar1 == 0x55) {
      uVar2 = GPR32DecoderTable[uVar4];
    }
    MCOperand_CreateReg0(Inst,uVar2);
    MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar3]);
    uVar1 = uVar6 ^ 0x3f;
    uVar3 = 0xffffffff;
    do {
      uVar2 = uVar3 + 1;
      if (uVar3 == 0x1d) break;
      uVar1 = uVar1 * 2;
      uVar3 = uVar2;
    } while (-1 < (int)uVar1);
    if (0x1e < uVar2) {
      return MCDisassembler_Fail;
    }
    if ((uVar6 | -(0x40000000U >> ((byte)uVar2 & 0x1f))) == 0xffffffff) {
      return MCDisassembler_Fail;
    }
    uVar5 = uVar5 & 0xfff;
  }
  MCOperand_CreateImm0(Inst,(ulong)uVar5);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Datasize = fieldFromInstruction(insn, 31, 1);
	unsigned imm;

	if (Datasize) {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSXri)
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 13);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 64))
			return Fail;
	} else {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSWri)
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 12);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 32))
			return Fail;
	}

	MCOperand_CreateImm0(Inst, imm);
	return Success;
}